

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::XmlTestReporterFixtureMultipleFailuresHelper::RunImpl
          (XmlTestReporterFixtureMultipleFailuresHelper *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char *local_58;
  char *expected;
  TestDetails failedDetails2;
  TestDetails failedDetails1;
  XmlTestReporterFixtureMultipleFailuresHelper *this_local;
  
  UnitTest::TestDetails::TestDetails
            ((TestDetails *)&failedDetails2.lineNumber,"FailedTest","suite","fail.h",1);
  UnitTest::TestDetails::TestDetails((TestDetails *)&expected,"FailedTest","suite","fail.h",0x1f);
  UnitTest::DeferredTestReporter::ReportTestStart
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&failedDetails2.lineNumber);
  UnitTest::DeferredTestReporter::ReportFailure
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&failedDetails2.lineNumber,"expected 1 but was 2");
  UnitTest::DeferredTestReporter::ReportFailure
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&expected,"expected one but was two");
  UnitTest::DeferredTestReporter::ReportTestFinish
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&failedDetails2.lineNumber,0.1);
  UnitTest::XmlTestReporter::ReportSummary(&(this->super_XmlTestReporterFixture).reporter,1,1,2,1.1)
  ;
  local_58 = 
  "<?xml version=\"1.0\"?><unittest-results tests=\"1\" failedtests=\"1\" failures=\"2\" time=\"1.1\"><test suite=\"suite\" name=\"FailedTest\" time=\"0.1\"><failure message=\"fail.h(1) : expected 1 but was 2\"/><failure message=\"fail.h(31) : expected one but was two\"/></test></unittest-results>"
  ;
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  std::__cxx11::ostringstream::str();
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_a8,*ppTVar2,0xb4);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>(results,&local_58,&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, MultipleFailures)
{
    TestDetails const failedDetails1("FailedTest", "suite", "fail.h", 1);
    TestDetails const failedDetails2("FailedTest", "suite", "fail.h", 31);

    reporter.ReportTestStart(failedDetails1);
    reporter.ReportFailure(failedDetails1, "expected 1 but was 2");
    reporter.ReportFailure(failedDetails2, "expected one but was two");
    reporter.ReportTestFinish(failedDetails1, 0.1f);

    reporter.ReportSummary(1, 1, 2, 1.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"2\" time=\"1.1\">"
        "<test suite=\"suite\" name=\"FailedTest\" time=\"0.1\">"
        "<failure message=\"fail.h(1) : expected 1 but was 2\"/>"
        "<failure message=\"fail.h(31) : expected one but was two\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}